

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

RandomBernoulliLikeLayerParams * __thiscall
CoreML::Specification::RandomBernoulliLikeLayerParams::New
          (RandomBernoulliLikeLayerParams *this,Arena *arena)

{
  RandomBernoulliLikeLayerParams *this_00;
  
  this_00 = (RandomBernoulliLikeLayerParams *)operator_new(0x20);
  RandomBernoulliLikeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomBernoulliLikeLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RandomBernoulliLikeLayerParams* RandomBernoulliLikeLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomBernoulliLikeLayerParams* n = new RandomBernoulliLikeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}